

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall
FIX::Message::Message
          (Message *this,message_order *headerOrder,message_order *trailerOrder,message_order *order
          ,string *string,DataDictionary *sessionDataDictionary,
          DataDictionary *applicationDataDictionary,bool validate)

{
  bool bVar1;
  bool validate_local;
  DataDictionary *sessionDataDictionary_local;
  string *string_local;
  message_order *order_local;
  message_order *trailerOrder_local;
  message_order *headerOrder_local;
  Message *this_local;
  
  FieldMap::FieldMap(&this->super_FieldMap,order);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_00330260;
  Header::Header(&this->m_header,headerOrder);
  Trailer::Trailer(&this->m_trailer,trailerOrder);
  this->m_validStructure = true;
  setStringHeader(this,string);
  bVar1 = isAdmin(this);
  if (bVar1) {
    setString(this,string,validate,sessionDataDictionary,sessionDataDictionary);
  }
  else {
    setString(this,string,validate,sessionDataDictionary,applicationDataDictionary);
  }
  return;
}

Assistant:

Message::Message(
    const message_order &headerOrder,
    const message_order &trailerOrder,
    const message_order &order,
    const std::string &string,
    const DataDictionary &sessionDataDictionary,
    const DataDictionary &applicationDataDictionary,
    bool validate) EXCEPT(InvalidMessage)
    : FieldMap(order),
      m_header(headerOrder),
      m_trailer(trailerOrder),
      m_validStructure(true) {
  setStringHeader(string);
  if (isAdmin()) {
    setString(string, validate, &sessionDataDictionary, &sessionDataDictionary);
  } else {
    setString(string, validate, &sessionDataDictionary, &applicationDataDictionary);
  }
}